

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O2

void __thiscall
duckdb::ParquetMetaDataOperatorData::ExecuteBloomProbe
          (ParquetMetaDataOperatorData *this,ClientContext *context,
          vector<duckdb::LogicalType,_true> *return_types,OpenFileInfo *file,string *column_name,
          Value *probe)

{
  ColumnDataCollection *this_00;
  __type _Var1;
  bool value;
  pointer pPVar2;
  reference __lhs;
  type __args_1;
  idx_t iVar3;
  const_reference pvVar4;
  vector<duckdb_parquet::RowGroup,_true> *this_01;
  const_reference pvVar5;
  const_reference pvVar6;
  type file_proto;
  long value_00;
  ulong uVar7;
  InvalidInputException *this_02;
  pointer *__ptr;
  idx_t column_idx;
  ulong uVar8;
  ulong __n;
  _Head_base<0UL,_duckdb::ParquetReader_*,_false> local_238;
  optional_idx probe_column_idx;
  __uniq_ptr_impl<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>,_std::default_delete<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>_>_>
  local_220;
  ColumnDataCollection *local_218;
  OpenFileInfo *local_210;
  FileMetaData *local_208;
  ParquetMetaDataOperatorData *local_200;
  Allocator *local_1f8;
  shared_ptr<duckdb::ThriftFileTransport> transport;
  ConstantFilter filter;
  DataChunk current_chunk;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  Value local_110;
  string local_d0;
  Value local_b0;
  ParquetOptions parquet_options;
  
  local_218 = &this->collection;
  local_200 = this;
  ColumnDataCollection::Reset(local_218);
  ParquetOptions::ParquetOptions(&parquet_options,context);
  local_210 = file;
  make_uniq<duckdb::ParquetReader,duckdb::ClientContext&,std::__cxx11::string_const&,duckdb::ParquetOptions&>
            ((duckdb *)&local_238,context,&file->path,&parquet_options);
  DataChunk::DataChunk(&current_chunk);
  DataChunk::Initialize(&current_chunk,context,return_types,0x800);
  pPVar2 = unique_ptr<duckdb::ParquetReader,_std::default_delete<duckdb::ParquetReader>,_true>::
           operator->((unique_ptr<duckdb::ParquetReader,_std::default_delete<duckdb::ParquetReader>,_true>
                       *)&local_238);
  local_208 = ParquetReader::GetFileMetadata(pPVar2);
  probe_column_idx.index = 0xffffffffffffffff;
  uVar8 = 0;
  while( true ) {
    pPVar2 = unique_ptr<duckdb::ParquetReader,_std::default_delete<duckdb::ParquetReader>,_true>::
             operator->((unique_ptr<duckdb::ParquetReader,_std::default_delete<duckdb::ParquetReader>,_true>
                         *)&local_238);
    if ((ulong)(((long)(pPVar2->super_BaseFileReader).columns.
                       super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                       .
                       super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pPVar2->super_BaseFileReader).columns.
                      super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                      .
                      super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x98) <= uVar8) break;
    pPVar2 = unique_ptr<duckdb::ParquetReader,_std::default_delete<duckdb::ParquetReader>,_true>::
             operator->((unique_ptr<duckdb::ParquetReader,_std::default_delete<duckdb::ParquetReader>,_true>
                         *)&local_238);
    __lhs = vector<duckdb::MultiFileColumnDefinition,_true>::get<true>
                      (&(pPVar2->super_BaseFileReader).columns,uVar8);
    _Var1 = ::std::operator==(&__lhs->name,column_name);
    if (_Var1) {
      optional_idx::optional_idx((optional_idx *)&filter,uVar8);
      probe_column_idx.index =
           CONCAT71(filter.super_TableFilter._vptr_TableFilter._1_7_,
                    filter.super_TableFilter._vptr_TableFilter._0_1_);
    }
    uVar8 = uVar8 + 1;
  }
  if (probe_column_idx.index != 0xffffffffffffffff) {
    local_1f8 = Allocator::DefaultAllocator();
    pPVar2 = unique_ptr<duckdb::ParquetReader,_std::default_delete<duckdb::ParquetReader>,_true>::
             operator->((unique_ptr<duckdb::ParquetReader,_std::default_delete<duckdb::ParquetReader>,_true>
                         *)&local_238);
    __args_1 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
               ::operator*(&pPVar2->file_handle);
    filter.super_TableFilter._vptr_TableFilter._0_1_ = 0;
    ::std::make_shared<duckdb::ThriftFileTransport,duckdb::CachingFileHandle&,bool>
              ((CachingFileHandle *)&transport,(bool *)__args_1);
    make_uniq<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>,std::shared_ptr<duckdb::ThriftFileTransport>>
              ((duckdb *)&local_220,&transport);
    pPVar2 = unique_ptr<duckdb::ParquetReader,_std::default_delete<duckdb::ParquetReader>,_true>::
             operator->((unique_ptr<duckdb::ParquetReader,_std::default_delete<duckdb::ParquetReader>,_true>
                         *)&local_238);
    iVar3 = optional_idx::GetIndex(&probe_column_idx);
    pvVar4 = vector<duckdb::MultiFileColumnDefinition,_true>::get<true>
                       (&(pPVar2->super_BaseFileReader).columns,iVar3);
    Value::CastAs(&local_b0,probe,context,&pvVar4->type,false);
    ConstantFilter::ConstantFilter(&filter,COMPARE_BOUNDARY_START,&local_b0);
    Value::~Value(&local_b0);
    this_01 = &local_208->row_groups;
    uVar8 = 0;
    for (__n = 0; this_00 = local_218,
        __n < (ulong)(((long)(local_208->row_groups).
                             super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                             .
                             super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_208->row_groups).
                            super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                            .
                            super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x60); __n = __n + 1) {
      pvVar5 = vector<duckdb_parquet::RowGroup,_true>::get<true>(this_01,__n);
      iVar3 = optional_idx::GetIndex(&probe_column_idx);
      pvVar6 = vector<duckdb_parquet::ColumnChunk,_true>::get<true>(&pvVar5->columns,iVar3);
      file_proto = unique_ptr<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>,_std::default_delete<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>_>,_true>
                   ::operator*((unique_ptr<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>,_std::default_delete<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>_>,_true>
                                *)&local_220);
      value = ParquetStatisticsUtils::BloomFilterExcludes
                        (&filter.super_TableFilter,&pvVar6->meta_data,(TProtocol *)file_proto,
                         local_1f8);
      ::std::__cxx11::string::string((string *)&local_d0,(string *)local_210);
      Value::Value(&local_110,&local_d0);
      DataChunk::SetValue(&current_chunk,0,uVar8,&local_110);
      Value::~Value(&local_110);
      ::std::__cxx11::string::~string((string *)&local_d0);
      value_00 = NumericCastImpl<long,_unsigned_long,_false>::Convert(__n);
      Value::BIGINT(&local_110,value_00);
      DataChunk::SetValue(&current_chunk,1,uVar8,&local_110);
      Value::~Value(&local_110);
      Value::BOOLEAN(&local_110,value);
      DataChunk::SetValue(&current_chunk,2,uVar8,&local_110);
      Value::~Value(&local_110);
      uVar7 = uVar8 + 1;
      if (0x7fe < uVar8) {
        current_chunk.count = uVar7;
        ColumnDataCollection::Append(local_218,&current_chunk);
        DataChunk::Reset(&current_chunk);
        uVar7 = 0;
      }
      uVar8 = uVar7;
    }
    current_chunk.count = uVar8;
    ColumnDataCollection::Append(local_218,&current_chunk);
    ColumnDataCollection::InitializeScan(this_00,&local_200->scan_state,ALLOW_ZERO_COPY);
    ConstantFilter::~ConstantFilter(&filter);
    if ((_Tuple_impl<0UL,_duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>_*,_std::default_delete<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>_>_>
         )local_220._M_t.
          super__Tuple_impl<0UL,_duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>_*,_std::default_delete<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>_>_>
          .
          super__Head_base<0UL,_duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>_*,_false>
          ._M_head_impl != (TCompactProtocolT<duckdb::ThriftFileTransport> *)0x0) {
      (**(code **)(*(long *)local_220._M_t.
                            super__Tuple_impl<0UL,_duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>_*,_std::default_delete<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>_>_>
                            .
                            super__Head_base<0UL,_duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>_*,_false>
                            ._M_head_impl + 8))();
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&transport.
                super___shared_ptr<duckdb::ThriftFileTransport,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    DataChunk::~DataChunk(&current_chunk);
    if (local_238._M_head_impl != (ParquetReader *)0x0) {
      (*((local_238._M_head_impl)->super_BaseFileReader)._vptr_BaseFileReader[1])();
    }
    ParquetOptions::~ParquetOptions(&parquet_options);
    return;
  }
  this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&filter,"Column %s not found in %s",(allocator *)&local_110);
  ::std::__cxx11::string::string((string *)&local_130,(string *)column_name);
  ::std::__cxx11::string::string((string *)&local_150,(string *)local_210);
  InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
            (this_02,(string *)&filter,&local_130,&local_150);
  __cxa_throw(this_02,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ParquetMetaDataOperatorData::ExecuteBloomProbe(ClientContext &context, const vector<LogicalType> &return_types,
                                                    const OpenFileInfo &file, const string &column_name,
                                                    const Value &probe) {
	collection.Reset();
	ParquetOptions parquet_options(context);
	auto reader = make_uniq<ParquetReader>(context, file.path, parquet_options);
	idx_t count = 0;
	DataChunk current_chunk;
	current_chunk.Initialize(context, return_types);
	auto meta_data = reader->GetFileMetadata();

	optional_idx probe_column_idx;
	for (idx_t column_idx = 0; column_idx < reader->columns.size(); column_idx++) {
		if (reader->columns[column_idx].name == column_name) {
			probe_column_idx = column_idx;
		}
	}

	if (!probe_column_idx.IsValid()) {
		throw InvalidInputException("Column %s not found in %s", column_name, file.path);
	}

	auto &allocator = Allocator::DefaultAllocator();
	auto transport = std::make_shared<ThriftFileTransport>(reader->GetHandle(), false);
	auto protocol =
	    make_uniq<duckdb_apache::thrift::protocol::TCompactProtocolT<ThriftFileTransport>>(std::move(transport));

	D_ASSERT(!probe.IsNull());
	ConstantFilter filter(ExpressionType::COMPARE_EQUAL,
	                      probe.CastAs(context, reader->GetColumns()[probe_column_idx.GetIndex()].type));

	for (idx_t row_group_idx = 0; row_group_idx < meta_data->row_groups.size(); row_group_idx++) {
		auto &row_group = meta_data->row_groups[row_group_idx];
		auto &column = row_group.columns[probe_column_idx.GetIndex()];

		auto bloom_excludes =
		    ParquetStatisticsUtils::BloomFilterExcludes(filter, column.meta_data, *protocol, allocator);
		current_chunk.SetValue(0, count, Value(file.path));
		current_chunk.SetValue(1, count, Value::BIGINT(NumericCast<int64_t>(row_group_idx)));
		current_chunk.SetValue(2, count, Value::BOOLEAN(bloom_excludes));

		count++;
		if (count >= STANDARD_VECTOR_SIZE) {
			current_chunk.SetCardinality(count);
			collection.Append(current_chunk);

			count = 0;
			current_chunk.Reset();
		}
	}

	current_chunk.SetCardinality(count);
	collection.Append(current_chunk);
	collection.InitializeScan(scan_state);
}